

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

void * ON_BinarySearchArrayFirstUnsignedInt
                 (uint key,void *base,size_t count,size_t sizeof_element,size_t key_offset)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  if ((key_offset + 4 <= sizeof_element && (base != (void *)0x0 && count != 0)) &&
     (lVar3 = (long)base + key_offset, key <= *(uint *)((count - 1) * sizeof_element + lVar3))) {
    pvVar2 = (void *)0x0;
    do {
      uVar4 = count >> 1;
      uVar1 = *(uint *)(lVar3 + uVar4 * sizeof_element);
      if (uVar1 <= key) {
        if (uVar1 < key) {
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + uVar4 * sizeof_element;
        }
        else {
          pvVar2 = (void *)((uVar4 * sizeof_element - key_offset) + lVar3);
          if (count < 2) {
            return pvVar2;
          }
        }
        uVar4 = count - uVar4;
      }
      count = uVar4;
    } while (uVar4 != 0);
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

const void* ON_BinarySearchArrayFirstUnsignedInt(
  unsigned int key,
  const void* base,
  size_t count,
  size_t sizeof_element,
  size_t key_offset
)
{
  void* rc = nullptr;

  if (count > 0 && nullptr != base && key_offset + sizeof(key) <= sizeof_element)
  {
    const unsigned char* a = (const unsigned char*)base;
    a += key_offset;

    size_t i;
    unsigned int d = *((const unsigned int*)(a + (count - 1) * sizeof_element));
    if (key <= d)
    {
      while (count > 0)
      {
        i = count / 2;
        d = *((const unsigned int*)(a + i * sizeof_element));
        if (key < d)
        {
          count = i;
        }
        else if (key > d)
        {
          i++;
          a += (i * sizeof_element);
          count -= i;
        }
        else
        {
          rc = (void*)(a + ((i * sizeof_element) - key_offset));
          if (i == 0) break;
          count -= i;
        }
      }
    }
  }
  return rc;
}